

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

void __thiscall DLoadSaveMenu::ExtractSaveData(DLoadSaveMenu *this,int index)

{
  FSaveGameNode *pFVar1;
  FILE *__stream;
  PNGHandle *png;
  char *pcVar2;
  char *__s;
  size_t __n;
  size_t __n_00;
  BYTE *string;
  FBrokenLines *pFVar3;
  FTexture *pFVar4;
  ulong uVar5;
  long lVar6;
  
  UnloadSaveData(this);
  if ((((SaveGames.Count <= (uint)index) ||
       (pFVar1 = SaveGames.Array[index], pFVar1 == (FSaveGameNode *)0x0)) ||
      (pcVar2 = (pFVar1->Filename).Chars, *(int *)(pcVar2 + -0xc) == 0)) ||
     (pFVar1->bOldVersion != false)) {
    return;
  }
  __stream = fopen(pcVar2,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  png = M_VerifyPNG((FILE *)__stream);
  if (png == (PNGHandle *)0x0) goto LAB_00334901;
  pcVar2 = M_GetPNGText(png,"Creation Time");
  __s = M_GetPNGText(png,"Comment");
  if (__s == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(__s);
  }
  if (pcVar2 == (char *)0x0) {
    if (__n + 1 != 0) {
      string = (BYTE *)operator_new__(__n + 1);
LAB_00334809:
      lVar6 = 0;
      goto LAB_0033480c;
    }
  }
  else {
    __n_00 = strlen(pcVar2);
    uVar5 = __n_00 + __n + 3;
    if (uVar5 != 0) {
      string = (BYTE *)operator_new__(uVar5);
      if (__n_00 == 0) goto LAB_00334809;
      memcpy(string,pcVar2,__n_00);
      (string + __n_00)[0] = '\n';
      (string + __n_00)[1] = '\n';
      lVar6 = __n_00 + 2;
LAB_0033480c:
      if (__n != 0) {
        memcpy(string + lVar6,__s,__n);
      }
      string[__n + lVar6] = '\0';
      pFVar3 = V_BreakLines(SmallFont,
                            (((screen->super_DSimpleCanvas).super_DCanvas.Width * 0xd8) / 0x280) /
                            CleanXfac,string,false);
      this->SaveComment = pFVar3;
      operator_delete__(string);
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
  }
  pFVar4 = PNGTexture_CreateFromFile(png,&pFVar1->Filename);
  this->SavePic = pFVar4;
  PNGHandle::~PNGHandle(png);
  operator_delete(png,0x38);
  pFVar4 = this->SavePic;
  if ((pFVar4->Width == 1) && (pFVar4->Height == 1)) {
    (*pFVar4->_vptr_FTexture[1])();
    this->SavePic = (FTexture *)0x0;
  }
LAB_00334901:
  fclose(__stream);
  return;
}

Assistant:

void DLoadSaveMenu::ExtractSaveData (int index)
{
	FILE *file;
	PNGHandle *png;
	FSaveGameNode *node;

	UnloadSaveData ();

	if ((unsigned)index < SaveGames.Size() &&
		(node = SaveGames[index]) &&
		!node->Filename.IsEmpty() &&
		!node->bOldVersion &&
		(file = fopen (node->Filename.GetChars(), "rb")) != NULL)
	{
		if (NULL != (png = M_VerifyPNG (file)))
		{
			char *time, *pcomment, *comment;
			size_t commentlen, totallen, timelen;

			// Extract comment
			time = M_GetPNGText (png, "Creation Time");
			pcomment = M_GetPNGText (png, "Comment");
			if (pcomment != NULL)
			{
				commentlen = strlen (pcomment);
			}
			else
			{
				commentlen = 0;
			}
			if (time != NULL)
			{
				timelen = strlen (time);
				totallen = timelen + commentlen + 3;
			}
			else
			{
				timelen = 0;
				totallen = commentlen + 1;
			}
			if (totallen != 0)
			{
				comment = new char[totallen];

				if (timelen)
				{
					memcpy (comment, time, timelen);
					comment[timelen] = '\n';
					comment[timelen+1] = '\n';
					timelen += 2;
				}
				if (commentlen)
				{
					memcpy (comment + timelen, pcomment, commentlen);
				}
				comment[timelen+commentlen] = 0;
				SaveComment = V_BreakLines (SmallFont, 216*screen->GetWidth()/640/CleanXfac, comment);
				delete[] comment;
				delete[] time;
				delete[] pcomment;
			}

			// Extract pic
			SavePic = PNGTexture_CreateFromFile(png, node->Filename);
			delete png;
			if (SavePic->GetWidth() == 1 && SavePic->GetHeight() == 1)
			{
				delete SavePic;
				SavePic = NULL;
			}
		}
		fclose (file);
	}
}